

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::SetOutParamMaxDepth(FunctionBody *this,RegSlot cOutParamsDepth)

{
  bool bVar1;
  uint32 local_14;
  RegSlot minAsmJsOutParams;
  RegSlot cOutParamsDepth_local;
  FunctionBody *this_local;
  
  bVar1 = GetIsAsmJsFunction(this);
  local_14 = cOutParamsDepth;
  if ((bVar1) && (cOutParamsDepth < 8)) {
    local_14 = 8;
  }
  SetCountField(this,OutParamMaxDepth,local_14);
  return;
}

Assistant:

void
    FunctionBody::SetOutParamMaxDepth(RegSlot cOutParamsDepth)
    {
#if _M_X64
        constexpr RegSlot minAsmJsOutParams = MinAsmJsOutParams();
        if (GetIsAsmJsFunction() && cOutParamsDepth < minAsmJsOutParams)
        {
            cOutParamsDepth = minAsmJsOutParams;
        }
#endif
        SetCountField(CounterFields::OutParamMaxDepth, cOutParamsDepth);
    }